

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::set_queue_position(torrent *this,queue_position_t p)

{
  session_interface *psVar1;
  bool bVar2;
  torrent *this_local;
  queue_position_t p_local;
  
  this_local._4_4_ = p.m_val;
  if (((((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
       (bVar2 = is_finished(this), !bVar2)) ||
      (bVar2 = strong_typedef<int,_libtorrent::queue_position_tag,_void>::operator!=
                         ((strong_typedef<int,_libtorrent::queue_position_tag,_void> *)
                          ((long)&this_local + 4),
                          (strong_typedef<int,_libtorrent::queue_position_tag,_void> *)&no_pos),
      !bVar2)) &&
     (bVar2 = strong_typedef<int,_libtorrent::queue_position_tag,_void>::operator==
                        ((strong_typedef<int,_libtorrent::queue_position_tag,_void> *)
                         ((long)&this_local + 4),&this->m_sequence_number), !bVar2)) {
    state_updated(this);
    psVar1 = (this->super_torrent_hot_members).m_ses;
    (*(psVar1->super_session_logger)._vptr_session_logger[0x1b])
              (psVar1,this,(ulong)(uint)this_local._4_4_);
  }
  return;
}

Assistant:

void torrent::set_queue_position(queue_position_t const p)
	{
		TORRENT_ASSERT(is_single_thread());

		// finished torrents may not change their queue positions, as it's set to
		// -1
		if ((m_abort || is_finished()) && p != no_pos) return;

		TORRENT_ASSERT((p == no_pos) == is_finished()
			|| (!m_auto_managed && p == no_pos)
			|| (m_abort && p == no_pos)
			|| (!m_added && p == no_pos));
		if (p == m_sequence_number) return;

		TORRENT_ASSERT(p >= no_pos);

		state_updated();

		m_ses.set_queue_position(this, p);
	}